

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,REF_BOOL *all_done)

{
  uint uVar1;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_ADAPT pRVar2;
  REF_CELL pRVar3;
  bool bVar4;
  uint uVar5;
  REF_STATUS RVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  REF_DBL RVar12;
  double dVar13;
  REF_INT max_age;
  REF_INT max_degree;
  REF_INT nnode;
  REF_DBL min_normdev;
  REF_DBL complexity;
  REF_DBL max_det;
  REF_INT int_mixed;
  REF_INT part;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_DBL volume;
  REF_INT degree;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_EDGE ref_edge;
  REF_DBL ratio;
  REF_DBL det;
  REF_LONG ncell;
  REF_DBL normdev;
  REF_INT local_mixed;
  REF_INT age;
  REF_DBL m [6];
  REF_INT nodes [27];
  uint local_1d4;
  uint local_1bc;
  REF_ADAPT local_1b8;
  uint local_1b0;
  uint local_1ac;
  REF_DBL local_1a8;
  double local_1a0;
  double local_198;
  int local_190;
  int local_18c;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  uint local_154;
  double local_150;
  double local_148;
  REF_BOOL *local_140;
  REF_EDGE local_138;
  double local_130;
  double local_128;
  long local_120;
  int local_114;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  REF_DBL local_e8;
  int local_e0;
  uint local_dc;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  pRVar2 = ref_grid->adapt;
  local_190 = 0;
  if ((((0 < ref_grid->cell[6]->n) || (0 < ref_grid->cell[9]->n)) || (0 < ref_grid->cell[10]->n)) ||
     (0 < ref_grid->cell[0xb]->n)) {
    local_190 = 1;
  }
  local_e0 = local_190;
  uVar5 = ref_mpi_max(ref_mpi,&local_e0,&local_190,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x9d,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  lVar7 = 0x28;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    lVar7 = 0x50;
  }
  local_114 = local_190;
  pRVar3 = *(REF_CELL *)((long)ref_grid->cell + lVar7 + -0x10);
  local_150 = 1.0;
  local_168 = 1e+200;
  local_170 = -1e+200;
  local_198 = -1.0;
  local_1a0 = 0.0;
  local_120 = 0;
  local_1b8 = pRVar2;
  local_140 = all_done;
  if (0 < pRVar3->max) {
    iVar9 = 0;
    local_1d4 = 0;
    do {
      RVar6 = ref_cell_nodes(pRVar3,iVar9,local_a8);
      if (RVar6 == 0) {
        if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
          uVar5 = ref_node_tet_quality(ref_grid->node,local_a8,&local_148);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0xb3,"ref_adapt_parameter",(ulong)uVar5,"qual");
            return uVar5;
          }
          uVar5 = ref_node_tet_vol(ref_grid->node,local_a8,&local_160);
          if (uVar5 != 0) {
            uVar8 = 0xb4;
LAB_001e9693:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,uVar8,"ref_adapt_parameter",(ulong)uVar5,"vol");
            local_1d4 = uVar5;
          }
        }
        else {
          uVar5 = ref_node_tri_quality(ref_grid->node,local_a8,&local_148);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0xaf,"ref_adapt_parameter",(ulong)uVar5,"qual");
            return uVar5;
          }
          uVar5 = ref_node_tri_area(ref_grid->node,local_a8,&local_160);
          if (uVar5 != 0) {
            uVar8 = 0xb0;
            goto LAB_001e9693;
          }
        }
        if (uVar5 != 0) {
          return local_1d4;
        }
        if (local_148 <= local_150) {
          local_150 = local_148;
        }
        if (local_160 <= local_168) {
          local_168 = local_160;
        }
        if (local_170 <= local_160) {
          local_170 = local_160;
        }
        if (0 < pRVar3->node_per) {
          lVar7 = 0;
          do {
            if (ref_node->ref_mpi->id == ref_node->part[local_a8[lVar7]]) {
              uVar5 = ref_node_metric_get(ref_node,local_a8[lVar7],&local_d8);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0xbc,"ref_adapt_parameter",(ulong)uVar5,"get");
                return uVar5;
              }
              uVar5 = ref_matrix_det_m(&local_d8,&local_128);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0xbd,"ref_adapt_parameter",(ulong)uVar5,"det");
                return uVar5;
              }
              if (local_198 <= local_128) {
                local_198 = local_128;
              }
              if (ref_grid->surf == 0) {
                if (0.0 < local_128) {
                  if (local_128 < 0.0) {
                    dVar10 = sqrt(local_128);
                  }
                  else {
                    dVar10 = SQRT(local_128);
                  }
                  local_1a0 = (dVar10 * local_160) / (double)pRVar3->node_per + local_1a0;
                }
              }
              else {
                uVar5 = ref_node_tri_area(ref_grid->node,local_a8,&local_1a8);
                if (uVar5 == 0) {
                  uVar5 = ref_node_tri_normal(ref_grid->node,local_a8,&local_108);
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0xc3,"ref_adapt_parameter",(ulong)uVar5,"norm");
                    local_1d4 = uVar5;
                    goto LAB_001e9884;
                  }
                  RVar6 = ref_math_normalize(&local_108);
                  bVar4 = true;
                  if (RVar6 == 0) {
                    dVar11 = (local_b0 * local_f8 + local_c8 * local_108 + local_100 * local_b8) *
                             local_f8 +
                             (local_c8 * local_f8 + local_d8 * local_108 + local_d0 * local_100) *
                             local_108 +
                             (local_b8 * local_f8 + local_d0 * local_108 + local_c0 * local_100) *
                             local_100;
                    dVar10 = dVar11 * 1e+20;
                    if (dVar10 <= -dVar10) {
                      dVar10 = -dVar10;
                    }
                    dVar13 = local_128;
                    if (local_128 <= -local_128) {
                      dVar13 = -local_128;
                    }
                    if (dVar13 < dVar10) {
                      dVar11 = local_128 / dVar11;
                      if (0.0 < dVar11) {
                        if (dVar11 < 0.0) {
                          dVar11 = sqrt(dVar11);
                        }
                        else {
                          dVar11 = SQRT(dVar11);
                        }
                        local_1a0 = (dVar11 * local_1a8) / (double)pRVar3->node_per + local_1a0;
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0xc1,"ref_adapt_parameter",(ulong)uVar5,"vol");
                  local_1d4 = uVar5;
LAB_001e9884:
                  bVar4 = false;
                }
                if (!bVar4) {
                  return local_1d4;
                }
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar3->node_per);
        }
        uVar5 = ref_cell_part(pRVar3,ref_node,iVar9,&local_18c);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xd6,"ref_adapt_parameter",(ulong)uVar5,"owner");
          return uVar5;
        }
        if (local_18c == ref_mpi->id) {
          local_120 = local_120 + 1;
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < pRVar3->max);
  }
  local_148 = local_150;
  uVar5 = ref_mpi_min(ref_mpi,&local_148,&local_150,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xda,
           "ref_adapt_parameter",(ulong)uVar5,"mpi min");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_148,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xdb,
           "ref_adapt_parameter",(ulong)uVar5,"mbast");
    return uVar5;
  }
  local_160 = local_168;
  uVar5 = ref_mpi_min(ref_mpi,&local_160,&local_168,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xdd,
           "ref_adapt_parameter",(ulong)uVar5,"mpi min");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_168,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xde,
           "ref_adapt_parameter",(ulong)uVar5,"bcast");
    return uVar5;
  }
  local_160 = local_170;
  uVar5 = ref_mpi_max(ref_mpi,&local_160,&local_170,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe0,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_170,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe1,
           "ref_adapt_parameter",(ulong)uVar5,"bcast");
    return uVar5;
  }
  local_128 = local_198;
  uVar5 = ref_mpi_max(ref_mpi,&local_128,&local_198,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe3,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_198,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe4,
           "ref_adapt_parameter",(ulong)uVar5,"bcast");
    return uVar5;
  }
  if (local_198 < 0.0) {
    local_188 = sqrt(local_198);
  }
  else {
    local_188 = SQRT(local_198);
  }
  local_188 = local_188 * 1e+20;
  if (local_198 < 0.0) {
    dVar10 = sqrt(local_198);
  }
  else {
    dVar10 = SQRT(local_198);
  }
  if (dVar10 * *(double *)(&DAT_00242330 + (ulong)(0.0 < local_188) * 8) <= 1.0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe5,
           "ref_adapt_parameter","can not invert sqrt(max_det)");
    return 1;
  }
  if (local_198 < 0.0) {
    local_188 = sqrt(local_198);
  }
  else {
    local_188 = SQRT(local_198);
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_1a0,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe8,
           "ref_adapt_parameter",(ulong)uVar5,"dbl sum");
    return uVar5;
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_120,1,2);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xe9,
           "ref_adapt_parameter",(ulong)uVar5,"cell int sum");
    return uVar5;
  }
  local_1ac = 0;
  if (0 < ref_node->max) {
    uVar5 = 0;
    lVar7 = 0;
    do {
      if ((-1 < ref_node->global[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) {
        uVar5 = uVar5 + 1;
        local_1ac = uVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < ref_node->max);
  }
  uVar5 = ref_mpi_allsum(ref_mpi,&local_1ac,1,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xf1,
           "ref_adapt_parameter",(ulong)uVar5,"int sum");
    return uVar5;
  }
  local_110 = (double)(int)local_1ac / local_1a0;
  local_1b0 = 0;
  if (0 < ref_node->max) {
    lVar7 = 0;
    do {
      uVar5 = local_1b0;
      if (-1 < ref_node->global[lVar7]) {
        uVar5 = ref_adj_degree(pRVar3->ref_adj,(REF_INT)lVar7,(REF_INT *)&local_154);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0xf7,"ref_adapt_parameter",(ulong)uVar5,"cell degree");
          return uVar5;
        }
        uVar5 = local_154;
        if ((int)local_154 < (int)local_1b0) {
          uVar5 = local_1b0;
        }
      }
      local_1b0 = uVar5;
      lVar7 = lVar7 + 1;
    } while (lVar7 < ref_node->max);
  }
  local_154 = local_1b0;
  uVar5 = ref_mpi_max(ref_mpi,&local_154,&local_1b0,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xfb,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1b0,1,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0xfc,
           "ref_adapt_parameter",(ulong)uVar5,"min");
    return uVar5;
  }
  local_1bc = 0;
  if (0 < ref_node->max) {
    uVar5 = 0;
    lVar7 = 0;
    do {
      if ((-1 < ref_node->global[lVar7]) &&
         (uVar1 = ref_node->age[lVar7], local_1bc = uVar5, (int)uVar5 <= (int)uVar1)) {
        uVar5 = uVar1;
        local_1bc = uVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < ref_node->max);
  }
  local_dc = local_1bc;
  uVar5 = ref_mpi_max(ref_mpi,&local_dc,&local_1bc,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x103,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1bc,1,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x104,
           "ref_adapt_parameter",(ulong)uVar5,"min");
    return uVar5;
  }
  local_1a8 = 2.0;
  if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) &&
     (pRVar3 = ref_grid->cell[3], 0 < pRVar3->max)) {
    iVar9 = 0;
    do {
      RVar6 = ref_cell_nodes(pRVar3,iVar9,local_a8);
      if (RVar6 == 0) {
        uVar5 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_108);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x10b,"ref_adapt_parameter",(ulong)uVar5,"norm dev");
          return uVar5;
        }
        if (local_108 <= local_1a8) {
          local_1a8 = local_108;
        }
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < pRVar3->max);
  }
  local_108 = local_1a8;
  uVar5 = ref_mpi_min(ref_mpi,&local_108,&local_1a8,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x110,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_1a8,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x111,
           "ref_adapt_parameter",(ulong)uVar5,"min");
    return uVar5;
  }
  local_178 = 1e+200;
  local_180 = -1e+200;
  uVar5 = ref_edge_create(&local_138,ref_grid);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x115,
           "ref_adapt_parameter",(ulong)uVar5,"make edges");
    return uVar5;
  }
  if (0 < local_138->n) {
    lVar7 = 0;
    do {
      uVar5 = ref_edge_part(local_138,(REF_INT)lVar7,&local_18c);
      if (uVar5 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x117,"ref_adapt_parameter",(ulong)uVar5,"edge part");
        return uVar5;
      }
      if (local_18c == ref_grid->mpi->id) {
        uVar5 = ref_node_ratio(ref_grid->node,local_138->e2n[lVar7 * 2],
                               local_138->e2n[lVar7 * 2 + 1],&local_130);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x11c,"ref_adapt_parameter",(ulong)uVar5,"rat");
          return uVar5;
        }
        if (local_130 <= local_178) {
          local_178 = local_130;
        }
        if (local_180 <= local_130) {
          local_180 = local_130;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_138->n);
  }
  uVar5 = ref_edge_free(local_138);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x121,
           "ref_adapt_parameter",(ulong)uVar5,"free edge");
    return uVar5;
  }
  local_130 = local_178;
  uVar5 = ref_mpi_min(ref_mpi,&local_130,&local_178,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x123,
           "ref_adapt_parameter",(ulong)uVar5,"mpi min");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_178,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x124,
           "ref_adapt_parameter",(ulong)uVar5,"min");
    return uVar5;
  }
  local_130 = local_180;
  uVar5 = ref_mpi_max(ref_mpi,&local_130,&local_180,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x126,
           "ref_adapt_parameter",(ulong)uVar5,"mpi max");
    return uVar5;
  }
  uVar5 = ref_mpi_bcast(ref_mpi,&local_180,1,3);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x127,
           "ref_adapt_parameter",(ulong)uVar5,"max");
    return uVar5;
  }
  dVar10 = 0.1;
  if (local_1a8 <= 0.1) {
    dVar10 = local_1a8;
  }
  if (dVar10 <= 0.001) {
    dVar10 = 0.001;
  }
  local_1b8->post_min_normdev = dVar10;
  local_e8 = 0.1;
  if (local_150 <= 0.1) {
    local_e8 = local_150;
  }
  local_188 = 1.0 / local_188;
  if (local_e8 <= 0.001) {
    local_e8 = 0.001;
  }
  local_1b8->collapse_quality_absolute = local_e8;
  local_1b8->smooth_min_quality = local_e8;
  RVar12 = 1e-15;
  if (local_188 * 0.01 <= 1e-15) {
    RVar12 = local_188 * 0.01;
  }
  ref_node->min_volume = RVar12;
  local_1b8->split_ratio_growth = 0;
  if (ref_grid->interp != (REF_INTERP)0x0) {
    local_1b8->split_ratio_growth = ref_grid->interp->continuously;
  }
  dVar10 = local_178;
  if (local_1b8->collapse_ratio <= local_178) {
    dVar10 = local_1b8->collapse_ratio;
  }
  local_1b8->post_min_ratio = dVar10;
  dVar11 = local_180;
  if (local_180 <= local_1b8->split_ratio) {
    dVar11 = local_1b8->split_ratio;
  }
  local_1b8->post_max_ratio = dVar11;
  if ((4.0 < dVar11) && (0.4 < dVar10)) {
    local_1b8->post_min_ratio = dVar10 * (4.0 / dVar11);
  }
  if (((dVar11 < 3.5) && (1.6 < dVar11)) && (0.4 < local_1b8->post_min_ratio)) {
    local_1b8->post_min_ratio = (1.4 / dVar11) * local_1b8->post_min_ratio;
  }
  RVar12 = 1.4142135623730951;
  if (local_114 < 1) {
    RVar12 = (REF_DBL)(~-(ulong)(3.0 < local_110) & 0x3ff6a09e667f3bcd |
                      (ulong)((local_180 + 1.4142135623730951) * 0.5) & -(ulong)(3.0 < local_110));
  }
  local_1b8->split_ratio = RVar12;
  dVar10 = local_1b8->post_min_ratio;
  dVar13 = local_1b8->last_min_ratio - dVar10;
  if (dVar13 <= -dVar13) {
    dVar13 = -dVar13;
  }
  if (dVar13 < dVar10 * 0.01) {
    dVar13 = local_1b8->last_max_ratio - dVar11;
    if (dVar13 <= -dVar13) {
      dVar13 = -dVar13;
    }
    if ((dVar13 < dVar11 * 0.01) &&
       ((((int)local_1bc < 0x32 || ((dVar11 < 3.0 && (0.1 < dVar10)))) &&
        (local_1b8->split_ratio <= 1.5 && local_1b8->split_ratio != 1.5)))) {
      *local_140 = 1;
      if (ref_grid->mpi->id == 0) {
        puts("termination recommended");
      }
      goto LAB_001ea9c6;
    }
  }
  *local_140 = 0;
LAB_001ea9c6:
  local_1d4 = ref_mpi_bcast(ref_mpi,local_140,1,1);
  if (local_1d4 == 0) {
    local_1b8->last_min_ratio = local_1b8->post_min_ratio;
    local_1b8->last_max_ratio = local_1b8->post_max_ratio;
    local_1d4 = 0;
    if (ref_grid->mpi->id == 0) {
      printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",local_e8,
             local_1b8->post_min_normdev,local_1b8->post_min_ratio,local_1b8->post_max_ratio,
             local_1b8->split_ratio);
      printf("max degree %d max age %d normdev %7.4f\n",local_1a8,(ulong)local_1b0,(ulong)local_1bc)
      ;
      printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n",local_1a0,local_110,
             (ulong)local_1ac,local_120);
      printf("volume range %e %e metric %e floor %e\n",local_170,local_168,local_188,
             ref_node->min_volume);
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x15c,
           "ref_adapt_parameter",(ulong)local_1d4,"done");
  }
  return local_1d4;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_parameter(REF_GRID ref_grid,
                                              REF_BOOL *all_done) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_ADAPT ref_adapt = ref_grid->adapt;
  REF_CELL ref_cell;
  REF_INT cell;
  REF_LONG ncell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL det, max_det, complexity, min_metric_vol;
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL volume, min_volume, max_volume;
  REF_DBL target_quality, target_normdev;
  REF_INT cell_node;
  REF_INT node, nnode;
  REF_DBL nodes_per_complexity;
  REF_INT degree, max_degree;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_INT edge, part;
  REF_INT age, max_age;
  REF_EDGE ref_edge;
  REF_DBL m[6];
  REF_INT int_mixed, local_mixed;
  REF_BOOL mixed;

  int_mixed = 0;
  if (ref_cell_n(ref_grid_qua(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_hex(ref_grid)) > 0)
    int_mixed = 1;
  local_mixed = int_mixed;
  RSS(ref_mpi_max(ref_mpi, &local_mixed, &int_mixed, REF_INT_TYPE), "mpi max");
  mixed = (int_mixed > 0);

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  max_det = -1.0;
  complexity = 0.0;
  ncell = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &volume), "vol");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    }
    min_quality = MIN(min_quality, quality);
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);

    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        RSS(ref_node_metric_get(ref_node, nodes[cell_node], m), "get");
        RSS(ref_matrix_det_m(m, &det), "det");
        max_det = MAX(max_det, det);
        if (ref_grid_surf(ref_grid)) {
          REF_DBL area, normal[3], normal_projection;
          RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
          RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, normal),
              "norm");

          if (REF_SUCCESS == ref_math_normalize(normal)) {
            normal_projection = ref_matrix_vt_m_v(m, normal);
            if (ref_math_divisible(det, normal_projection)) {
              if (det / normal_projection > 0.0) {
                complexity += sqrt(det / normal_projection) * area /
                              ((REF_DBL)ref_cell_node_per(ref_cell));
              }
            }
          }
        } else {
          if (det > 0.0) {
            complexity +=
                sqrt(det) * volume / ((REF_DBL)ref_cell_node_per(ref_cell));
          }
        }
      }
    }
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "owner");
    if (part == ref_mpi_rank(ref_mpi)) ncell++;
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "mbast");
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "bcast");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "bcast");
  det = max_det;
  RSS(ref_mpi_max(ref_mpi, &det, &max_det, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_det, 1, REF_DBL_TYPE), "bcast");
  RAS(ref_math_divisible(1.0, sqrt(max_det)), "can not invert sqrt(max_det)");
  min_metric_vol = 1.0 / sqrt(max_det);

  RSS(ref_mpi_allsum(ref_mpi, &complexity, 1, REF_DBL_TYPE), "dbl sum");
  RSS(ref_mpi_allsum(ref_mpi, &ncell, 1, REF_LONG_TYPE), "cell int sum");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  nodes_per_complexity = (REF_DBL)nnode / complexity;

  max_degree = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_adj_degree(ref_cell_adj(ref_cell), node, &degree), "cell degree");
    max_degree = MAX(max_degree, degree);
  }
  degree = max_degree;
  RSS(ref_mpi_max(ref_mpi, &degree, &max_degree, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_degree, 1, REF_INT_TYPE), "min");

  max_age = 0;
  each_ref_node_valid_node(ref_node, node) {
    max_age = MAX(max_age, ref_node_age(ref_node, node));
  }
  age = max_age;
  RSS(ref_mpi_max(ref_mpi, &age, &max_age, REF_INT_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_age, 1, REF_INT_TYPE), "min");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  target_normdev = MAX(MIN(0.1, min_normdev), 1.0e-3);
  ref_adapt->post_min_normdev = target_normdev;

  target_quality = MAX(MIN(0.1, min_quality), 1.0e-3);
  ref_adapt->collapse_quality_absolute = target_quality;
  ref_adapt->smooth_min_quality = target_quality;

  ref_node->min_volume = MIN(1.0e-15, 0.01 * min_metric_vol);

  /* allow edge growth when interpolating metric continuously */
  ref_adapt->split_ratio_growth = REF_FALSE;
  if (NULL != ref_grid_interp(ref_grid)) {
    ref_adapt->split_ratio_growth =
        ref_interp_continuously(ref_grid_interp(ref_grid));
  }

  /* bound ratio to current range */
  ref_adapt->post_min_ratio = MIN(min_ratio, ref_adapt->collapse_ratio);
  ref_adapt->post_max_ratio = MAX(max_ratio, ref_adapt->split_ratio);

  if (ref_adapt->post_max_ratio > 4.0 && ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (4.0 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  /* when close to convergence, prevent high lower limit from stopping split */
  if (ref_adapt->post_max_ratio < 3.5 && ref_adapt->post_max_ratio > 1.6 &&
      ref_adapt->post_min_ratio > 0.4) {
    ref_adapt->post_min_ratio =
        (1.4 / ref_adapt->post_max_ratio) * ref_adapt->post_min_ratio;
  }

  ref_adapt->split_ratio = sqrt(2.0);
  /* prevent overshoot of number of nodes, unless unreliable due to mixed */
  if (!mixed && nodes_per_complexity > 3.0)
    ref_adapt->split_ratio = 0.5 * (sqrt(2.0) + max_ratio);

  if (ABS(ref_adapt->last_min_ratio - ref_adapt->post_min_ratio) <
          1e-2 * ref_adapt->post_min_ratio &&
      ABS(ref_adapt->last_max_ratio - ref_adapt->post_max_ratio) <
          1e-2 * ref_adapt->post_max_ratio &&
      (max_age < 50 ||
       (ref_adapt->post_min_ratio > 0.1 && ref_adapt->post_max_ratio < 3.0)) &&
      1.5 > ref_adapt->split_ratio) {
    *all_done = REF_TRUE;
    if (ref_grid_once(ref_grid)) {
      printf("termination recommended\n");
    }
  } else {
    *all_done = REF_FALSE;
  }
  RSS(ref_mpi_bcast(ref_mpi, all_done, 1, REF_INT_TYPE), "done");

  ref_adapt->last_min_ratio = ref_adapt->post_min_ratio;
  ref_adapt->last_max_ratio = ref_adapt->post_max_ratio;

  if (ref_grid_once(ref_grid)) {
    printf("limit quality %6.4f normdev %6.4f ratio %6.4f %6.2f split %6.2f\n",
           target_quality, ref_adapt->post_min_normdev,
           ref_adapt->post_min_ratio, ref_adapt->post_max_ratio,
           ref_adapt->split_ratio);
    printf("max degree %d max age %d normdev %7.4f\n", max_degree, max_age,
           min_normdev);
    printf("nnode %10d ncell %12ld complexity %12.1f ratio %5.2f\n", nnode,
           ncell, complexity, nodes_per_complexity);
    printf("volume range %e %e metric %e floor %e\n", max_volume, min_volume,
           min_metric_vol, ref_node->min_volume);
  }

  return REF_SUCCESS;
}